

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::TimingCheckArgSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if (((kind == EmptyTimingCheckArg) || (kind == ExpressionTimingCheckArg)) ||
     (kind == TimingCheckEventArg)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool TimingCheckArgSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::EmptyTimingCheckArg:
        case SyntaxKind::ExpressionTimingCheckArg:
        case SyntaxKind::TimingCheckEventArg:
            return true;
        default:
            return false;
    }
}